

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O2

vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
find_database_file_abi_cxx11_(void)

{
  source_loc loc;
  source_loc loc_00;
  bool bVar1;
  logger *plVar2;
  path *file;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *in_RDI;
  directory_iterator local_118;
  directory_iterator __end1;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_e8 [40];
  char *local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_90;
  path local_80;
  path local_58;
  
  plVar2 = spdlog::default_logger_raw();
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
  ;
  uStack_b8 = 0xf4;
  local_b0 = "find_database_file";
  loc._12_4_ = uStack_b4;
  loc.line = 0xf4;
  loc.filename = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
  ;
  loc.funcname = "find_database_file";
  spdlog::logger::log<char[29],_0>(plVar2,loc,debug,(char (*) [29])"Looking for database file...");
  (in_RDI->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CLI::std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_f8,&app.dataset);
  CLI::std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,&local_f8);
  local_118._M_dir._M_ptr = local_a8._M_ptr;
  local_118._M_dir._M_refcount._M_pi = local_a8._M_refcount._M_pi;
  local_a8._M_ptr = (element_type *)0x0;
  local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  CLI::std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,&local_f8);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  do {
    if (local_118._M_dir._M_refcount._M_pi == __end1._M_dir._M_refcount._M_pi) {
LAB_0010e699:
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&__end1._M_dir._M_refcount);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_118._M_dir._M_refcount);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
      return in_RDI;
    }
    file = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_118);
    if (app.type == 0) {
      bVar1 = is_db_file(file);
      if (bVar1) {
        plVar2 = spdlog::default_logger_raw();
        CLI::std::filesystem::__cxx11::path::string(&local_58._M_pathname,file);
        local_e8._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
        ;
        local_e8._8_4_ = 0x102;
        local_e8._16_8_ = "find_database_file";
        local_80._M_pathname._M_dataplus._M_p = "Found DB file {}";
        local_80._M_pathname._M_string_length = 0x10;
        loc_00._12_4_ = local_e8._12_4_;
        loc_00.line = 0x102;
        loc_00.filename =
             "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/apps/image_match.cpp"
        ;
        loc_00.funcname = "find_database_file";
        spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
                  (plVar2,loc_00,debug,(basic_string_view<char> *)&local_80,&local_58._M_pathname);
        std::__cxx11::string::~string((string *)&local_58);
        CLI::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back(in_RDI,file);
      }
    }
    else {
      std::filesystem::absolute((path *)local_e8);
      std::filesystem::__cxx11::path::lexically_normal();
      database_filename_abi_cxx11_();
      bVar1 = CLI::std::filesystem::__cxx11::operator==(&local_58,&local_80);
      CLI::std::filesystem::__cxx11::path::~path(&local_80);
      CLI::std::filesystem::__cxx11::path::~path(&local_58);
      CLI::std::filesystem::__cxx11::path::~path((path *)local_e8);
      if (bVar1) {
        CLI::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        push_back(in_RDI,file);
        goto LAB_0010e699;
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_118);
  } while( true );
}

Assistant:

std::vector<path>
find_database_file()
{
    SPDLOG_DEBUG("Looking for database file...");

    std::vector<path> ans;
    for (auto&& dir_entry : directory_iterator(app.dataset)) {
        if (app.type) {
            if (absolute(dir_entry.path()).lexically_normal() ==
                database_filename()) {
                ans.push_back(dir_entry.path());
                return ans;
            }
            continue;
        }

        if (is_db_file(dir_entry.path())) {
            SPDLOG_DEBUG("Found DB file {}", dir_entry.path().string());
            ans.push_back(dir_entry.path());
        }
    }

    return ans;
}